

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O0

int Gia_ManSatAndCollect_rec(Gia_Man_t *p,int iObj,Vec_Int_t *vObjsUsed,Vec_Int_t *vCiVars)

{
  int iVar1;
  Gia_Obj_t *pObj_00;
  int iVar;
  Gia_Obj_t *pObj;
  Vec_Int_t *vCiVars_local;
  Vec_Int_t *vObjsUsed_local;
  int iObj_local;
  Gia_Man_t *p_local;
  
  p_local._4_4_ = Gia_ObjCopyArray(p,iObj);
  if (p_local._4_4_ < 0) {
    pObj_00 = Gia_ManObj(p,iObj);
    iVar1 = Gia_ObjIsCand(pObj_00);
    if (iVar1 == 0) {
      __assert_fail("Gia_ObjIsCand(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/AbcGlucose.cpp"
                    ,0x3fb,
                    "int Gia_ManSatAndCollect_rec(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *)");
    }
    iVar1 = Gia_ObjIsAnd(pObj_00);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFaninId0(pObj_00,iObj);
      Gia_ManSatAndCollect_rec(p,iVar1,vObjsUsed,vCiVars);
      iVar1 = Gia_ObjFaninId1(pObj_00,iObj);
      Gia_ManSatAndCollect_rec(p,iVar1,vObjsUsed,vCiVars);
    }
    p_local._4_4_ = Vec_IntSize(vObjsUsed);
    Vec_IntPush(vObjsUsed,iObj);
    Gia_ObjSetCopyArray(p,iObj,p_local._4_4_);
    if ((vCiVars != (Vec_Int_t *)0x0) && (iVar1 = Gia_ObjIsCi(pObj_00), iVar1 != 0)) {
      Vec_IntPush(vCiVars,p_local._4_4_);
    }
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ManSatAndCollect_rec( Gia_Man_t * p, int iObj, Vec_Int_t * vObjsUsed, Vec_Int_t * vCiVars )
{
    Gia_Obj_t * pObj; int iVar;
    if ( (iVar = Gia_ObjCopyArray(p, iObj)) >= 0 )
        return iVar;
    pObj = Gia_ManObj( p, iObj );
    assert( Gia_ObjIsCand(pObj) );
    if ( Gia_ObjIsAnd(pObj) )
    {
        Gia_ManSatAndCollect_rec( p, Gia_ObjFaninId0(pObj, iObj), vObjsUsed, vCiVars );
        Gia_ManSatAndCollect_rec( p, Gia_ObjFaninId1(pObj, iObj), vObjsUsed, vCiVars );
    }
    iVar = Vec_IntSize( vObjsUsed );
    Vec_IntPush( vObjsUsed, iObj );
    Gia_ObjSetCopyArray( p, iObj, iVar );
    if ( vCiVars && Gia_ObjIsCi(pObj) )
        Vec_IntPush( vCiVars, iVar );
    return iVar;
}